

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O2

void __thiscall
t_netstd_generator::generate_netstd_union_definition
          (t_netstd_generator *this,ostream *out,t_struct *tunion)

{
  int *piVar1;
  t_program *program;
  t_struct *ptVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  pointer pptVar5;
  string *psVar6;
  t_struct undefined_struct;
  bool needs_typecast;
  string local_180;
  t_struct *local_160;
  t_struct local_158;
  string local_90;
  string local_70;
  string local_50;
  
  start_netstd_namespace(this,out);
  t_generator::indent_abi_cxx11_((string *)&local_158,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_158);
  poVar4 = std::operator<<(poVar4,"public abstract partial class ");
  iVar3 = (*(tunion->super_t_type).super_t_doc._vptr_t_doc[3])(tunion);
  poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var,iVar3));
  poVar4 = std::operator<<(poVar4," : TUnionBase");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_158);
  t_generator::indent_abi_cxx11_((string *)&local_158,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_158);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_158);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_((string *)&local_158,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_158);
  poVar4 = std::operator<<(poVar4,
                           "public abstract global::System.Threading.Tasks.Task WriteAsync(TProtocol tProtocol, CancellationToken "
                          );
  poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,");");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_180);
  poVar4 = std::operator<<(poVar4,"public readonly int Isset;");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_90);
  poVar4 = std::operator<<(poVar4,"public abstract object Data { get; }");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_50);
  poVar4 = std::operator<<(poVar4,"protected ");
  iVar3 = (*(tunion->super_t_type).super_t_doc._vptr_t_doc[3])(tunion);
  poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_00,iVar3));
  poVar4 = std::operator<<(poVar4,"(int isset)");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_70);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_158);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_((string *)&local_158,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_158);
  poVar4 = std::operator<<(poVar4,"Isset = isset;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_158);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_((string *)&local_158,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_158);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  local_160 = tunion;
  std::__cxx11::string::~string((string *)&local_158);
  t_generator::indent_abi_cxx11_((string *)&local_158,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_158);
  poVar4 = std::operator<<(poVar4,"public override bool Equals(object that)");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_158);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  t_generator::indent_abi_cxx11_((string *)&local_158,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_158);
  ptVar2 = local_160;
  poVar4 = std::operator<<(poVar4,"if (!(that is ");
  iVar3 = (*(ptVar2->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar2);
  poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_01,iVar3));
  poVar4 = std::operator<<(poVar4," other)) return false;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_158);
  t_generator::indent_abi_cxx11_((string *)&local_158,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_158);
  poVar4 = std::operator<<(poVar4,"if (ReferenceEquals(this, other)) return true;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_158);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_((string *)&local_158,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_158);
  poVar4 = std::operator<<(poVar4,"if(this.Isset != other.Isset) return false;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_158);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_((string *)&local_158,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_158);
  poVar4 = std::operator<<(poVar4,"switch (Isset)");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_158);
  psVar6 = (string *)out;
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  for (pptVar5 = (local_160->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar5 !=
      (local_160->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
    local_90._M_dataplus._M_p._0_1_ = 0;
    get_deep_copy_method_call_abi_cxx11_
              ((string *)&local_158,(t_netstd_generator *)psVar6,(*pptVar5)->type_,(bool *)&local_90
              );
    t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_180);
    poVar4 = std::operator<<(poVar4,"case ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(*pptVar5)->key_);
    poVar4 = std::operator<<(poVar4,":");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_180);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_180);
    poVar4 = std::operator<<(poVar4,"return Equals(As_");
    poVar4 = std::operator<<(poVar4,(string *)&(*pptVar5)->name_);
    poVar4 = std::operator<<(poVar4,", other.As_");
    poVar4 = std::operator<<(poVar4,(string *)&(*pptVar5)->name_);
    poVar4 = std::operator<<(poVar4,");");
    psVar6 = &::endl_abi_cxx11_;
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_180);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    std::__cxx11::string::~string((string *)&local_158);
  }
  t_generator::indent_abi_cxx11_((string *)&local_158,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_158);
  poVar4 = std::operator<<(poVar4,"default:");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_158);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_((string *)&local_158,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_158);
  poVar4 = std::operator<<(poVar4,"return true;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_158);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -2;
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_((string *)&local_158,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_158);
  poVar4 = std::operator<<(poVar4,"public override int GetHashCode()");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_158);
  t_generator::indent_abi_cxx11_((string *)&local_158,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_158);
  ptVar2 = local_160;
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_158);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_((string *)&local_158,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_158);
  poVar4 = std::operator<<(poVar4,"switch (Isset)");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_158);
  t_generator::indent_abi_cxx11_((string *)&local_158,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_158);
  poVar4 = std::operator<<(poVar4,"{");
  psVar6 = &::endl_abi_cxx11_;
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_158);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  for (pptVar5 = (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar5 !=
      (local_160->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
    local_90._M_dataplus._M_p._0_1_ = 0;
    get_deep_copy_method_call_abi_cxx11_
              ((string *)&local_158,(t_netstd_generator *)psVar6,(*pptVar5)->type_,(bool *)&local_90
              );
    t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_180);
    poVar4 = std::operator<<(poVar4,"case ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(*pptVar5)->key_);
    poVar4 = std::operator<<(poVar4,":");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_180);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_180);
    poVar4 = std::operator<<(poVar4,"return As_");
    poVar4 = std::operator<<(poVar4,(string *)&(*pptVar5)->name_);
    poVar4 = std::operator<<(poVar4,".GetHashCode();");
    psVar6 = &::endl_abi_cxx11_;
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_180);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    std::__cxx11::string::~string((string *)&local_158);
  }
  t_generator::indent_abi_cxx11_((string *)&local_158,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_158);
  poVar4 = std::operator<<(poVar4,"default:");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_158);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_((string *)&local_158,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_158);
  ptVar2 = local_160;
  poVar4 = std::operator<<(poVar4,"return (new ___undefined()).GetHashCode();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_158);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -2;
  t_generator::indent_abi_cxx11_((string *)&local_158,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_158);
  poVar4 = std::operator<<(poVar4,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_158);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_((string *)&local_158,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_158);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_158);
  if (this->suppress_deepcopy == false) {
    t_generator::indent_abi_cxx11_((string *)&local_158,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_158);
    poVar4 = std::operator<<(poVar4,"public ");
    iVar3 = (*(ptVar2->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar2);
    poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_02,iVar3));
    poVar4 = std::operator<<(poVar4," DeepCopy()");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_158);
    t_generator::indent_abi_cxx11_((string *)&local_158,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_158);
    poVar4 = std::operator<<(poVar4,"{");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_158);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_((string *)&local_158,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_158);
    poVar4 = std::operator<<(poVar4,"switch (Isset)");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_158);
    t_generator::indent_abi_cxx11_((string *)&local_158,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_158);
    poVar4 = std::operator<<(poVar4,"{");
    psVar6 = &::endl_abi_cxx11_;
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_158);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    for (pptVar5 = (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar5 !=
        (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
      local_90._M_dataplus._M_p._0_1_ = 0;
      get_deep_copy_method_call_abi_cxx11_
                ((string *)&local_158,(t_netstd_generator *)psVar6,(*pptVar5)->type_,
                 (bool *)&local_90);
      t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
      poVar4 = std::operator<<(out,(string *)&local_180);
      poVar4 = std::operator<<(poVar4,"case ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(*pptVar5)->key_);
      poVar4 = std::operator<<(poVar4,":");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_180);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
      poVar4 = std::operator<<(out,(string *)&local_180);
      poVar4 = std::operator<<(poVar4,"return new ");
      poVar4 = std::operator<<(poVar4,(string *)&(*pptVar5)->name_);
      poVar4 = std::operator<<(poVar4,"(As_");
      poVar4 = std::operator<<(poVar4,(string *)&(*pptVar5)->name_);
      poVar4 = std::operator<<(poVar4,(string *)&local_158);
      poVar4 = std::operator<<(poVar4,");");
      psVar6 = &::endl_abi_cxx11_;
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_180);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      std::__cxx11::string::~string((string *)&local_158);
    }
    t_generator::indent_abi_cxx11_((string *)&local_158,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_158);
    poVar4 = std::operator<<(poVar4,"default:");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_158);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_((string *)&local_158,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_158);
    poVar4 = std::operator<<(poVar4,"return new ___undefined();");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_158);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -2;
    t_generator::indent_abi_cxx11_((string *)&local_158,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_158);
    poVar4 = std::operator<<(poVar4,"}");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_158);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_((string *)&local_158,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_158);
    poVar4 = std::operator<<(poVar4,"}");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_158);
  }
  t_generator::indent_abi_cxx11_((string *)&local_158,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_158);
  poVar4 = std::operator<<(poVar4,"public class ___undefined : ");
  iVar3 = (*(ptVar2->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar2);
  poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_03,iVar3));
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_158);
  t_generator::indent_abi_cxx11_((string *)&local_158,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_158);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_158);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_((string *)&local_158,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_158);
  poVar4 = std::operator<<(poVar4,"public override object Data { get { return null; } }");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_180);
  poVar4 = std::operator<<(poVar4,"public ___undefined() : base(0) {}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_158);
  if (this->suppress_deepcopy == false) {
    t_generator::indent_abi_cxx11_((string *)&local_158,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_158);
    poVar4 = std::operator<<(poVar4,"public new ___undefined DeepCopy()");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_158);
    t_generator::indent_abi_cxx11_((string *)&local_158,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_158);
    poVar4 = std::operator<<(poVar4,"{");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_158);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_((string *)&local_158,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_158);
    poVar4 = std::operator<<(poVar4,"return new ___undefined();");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_158);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_((string *)&local_158,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_158);
    poVar4 = std::operator<<(poVar4,"}");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_158);
  }
  program = (this->super_t_oop_generator).super_t_generator.program_;
  std::__cxx11::string::string((string *)&local_180,"___undefined",(allocator *)&local_90);
  t_struct::t_struct(&local_158,program,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  generate_netstd_struct_equals(this,out,&local_158);
  generate_netstd_struct_hashcode(this,out,&local_158);
  t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_180);
  poVar4 = std::operator<<(poVar4,
                           "public override global::System.Threading.Tasks.Task WriteAsync(TProtocol oprot, CancellationToken "
                          );
  poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,")");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_90);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_180);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_180);
  poVar4 = std::operator<<(poVar4,
                           "throw new TProtocolException( TProtocolException.INVALID_DATA, \"Cannot persist an union type which is not set.\");"
                          );
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_180);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_180);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_180);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_180);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_180);
  for (pptVar5 = (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar5 !=
      (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
    generate_netstd_union_class(this,out,ptVar2,*pptVar5);
  }
  generate_netstd_union_reader(this,out,ptVar2);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_180);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_180);
  end_netstd_namespace(this,out);
  t_struct::~t_struct(&local_158);
  return;
}

Assistant:

void t_netstd_generator::generate_netstd_union_definition(ostream& out, t_struct* tunion)
{
    // Let's define the class first
    start_netstd_namespace(out);

    out << indent() << "public abstract partial class " << tunion->get_name() << " : TUnionBase" << endl;
    out << indent() << "{" << endl;
    indent_up();

    out << indent() << "public abstract global::System.Threading.Tasks.Task WriteAsync(TProtocol tProtocol, CancellationToken " << CANCELLATION_TOKEN_NAME << ");" << endl
        << indent() << "public readonly int Isset;" << endl
        << indent() << "public abstract object Data { get; }" << endl
        << indent() << "protected " << tunion->get_name() << "(int isset)" << endl
        << indent() << "{" << endl;
    indent_up();
    out << indent() << "Isset = isset;" << endl;
    indent_down();
    out << indent() << "}" << endl << endl;

    const vector<t_field*>& fields = tunion->get_members();
    vector<t_field*>::const_iterator f_iter;

    out << indent() << "public override bool Equals(object that)" << endl;
    scope_up(out);
    out << indent() << "if (!(that is " << tunion->get_name() << " other)) return false;" << endl;
    out << indent() << "if (ReferenceEquals(this, other)) return true;" << endl;
    out << endl;
    out << indent() << "if(this.Isset != other.Isset) return false;" << endl;
    out << endl;
    out << indent() << "switch (Isset)" << endl;
    scope_up(out);
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter)
    {
        bool needs_typecast = false;
        string copy_op = get_deep_copy_method_call((*f_iter)->get_type(), needs_typecast);
        out << indent() << "case " << (*f_iter)->get_key() << ":" << endl;
        indent_up();
        out << indent() << "return Equals(As_" << (*f_iter)->get_name() << ", other.As_" << (*f_iter)->get_name() << ");" << endl;
        indent_down();
    }
    out << indent() << "default:" << endl;
    indent_up();
    out << indent() << "return true;" << endl;
    indent_down();
    indent_down();
    scope_down(out);
    scope_down(out);
    out << endl;

    out << indent() << "public override int GetHashCode()" << endl;
    out << indent() << "{" << endl;
    indent_up();
    out << indent() << "switch (Isset)" << endl;
    out << indent() << "{" << endl;
    indent_up();
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter)
    {
        bool needs_typecast = false;
        string copy_op = get_deep_copy_method_call((*f_iter)->get_type(), needs_typecast);
        out << indent() << "case " << (*f_iter)->get_key() << ":" << endl;
        indent_up();
        out << indent() << "return As_" << (*f_iter)->get_name() << ".GetHashCode();" << endl;
        indent_down();
    }
    out << indent() << "default:" << endl;
    indent_up();
    out << indent() << "return (new ___undefined()).GetHashCode();" << endl;
    indent_down();
    indent_down();
    out << indent() << "}" << endl;
    indent_down();
    out << indent() << "}" << endl << endl;

    if( ! suppress_deepcopy) {
        out << indent() << "public " << tunion->get_name() << " DeepCopy()" << endl;
        out << indent() << "{" << endl;
        indent_up();
        out << indent() << "switch (Isset)" << endl;
        out << indent() << "{" << endl;
        indent_up();
        for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter)
        {
            bool needs_typecast = false;
            string copy_op = get_deep_copy_method_call((*f_iter)->get_type(), needs_typecast);
            out << indent() << "case " << (*f_iter)->get_key() << ":" << endl;
            indent_up();
            out << indent() << "return new " << (*f_iter)->get_name() << "(As_" << (*f_iter)->get_name() << copy_op << ");" << endl;
            indent_down();
        }
        out << indent() << "default:" << endl;
        indent_up();
        out << indent() << "return new ___undefined();" << endl;
        indent_down();
        indent_down();
        out << indent() << "}" << endl;
        indent_down();
        out << indent() << "}" << endl << endl;
    }

    out << indent() << "public class ___undefined : " << tunion->get_name() << endl;
    out << indent() << "{" << endl;
    indent_up();

    out << indent() << "public override object Data { get { return null; } }" << endl
        << indent() << "public ___undefined() : base(0) {}" << endl << endl;

    if( ! suppress_deepcopy) {
        out << indent() << "public new ___undefined DeepCopy()" << endl;
        out << indent() << "{" << endl;
        indent_up();
        out << indent() << "return new ___undefined();" << endl;
        indent_down();
        out << indent() << "}" << endl << endl;
    }

    t_struct undefined_struct(program_,"___undefined");
    generate_netstd_struct_equals(out, &undefined_struct);
    generate_netstd_struct_hashcode(out, &undefined_struct);

    out << indent() << "public override global::System.Threading.Tasks.Task WriteAsync(TProtocol oprot, CancellationToken " << CANCELLATION_TOKEN_NAME << ")" << endl
        << indent() << "{" << endl;
    indent_up();
    out << indent() << "throw new TProtocolException( TProtocolException.INVALID_DATA, \"Cannot persist an union type which is not set.\");" << endl;
    indent_down();
    out << indent() << "}" << endl << endl;
    indent_down();
    out << indent() << "}" << endl << endl;

    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter)
    {
        generate_netstd_union_class(out, tunion, (*f_iter));
    }

    generate_netstd_union_reader(out, tunion);

    indent_down();
    out << indent() << "}" << endl << endl;

    end_netstd_namespace(out);
}